

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdrawhelper.cpp
# Opt level: O0

void RadialFetchPlain<GradientBase32>::fetch
               (BlendType *buffer,BlendType *end,Operator *op,QSpanData *data,qreal det,
               qreal delta_det,qreal delta_delta_det,qreal b,qreal delta_b)

{
  Type TVar1;
  long in_RCX;
  long in_RDX;
  Type *in_RSI;
  Type *in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double in_XMM1_Qa;
  double in_XMM2_Qa;
  double in_XMM3_Qa;
  double in_XMM4_Qa;
  qreal w_1;
  BlendType result_1;
  qreal w;
  BlendType result;
  qreal in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  Type local_4c;
  double local_40;
  double local_30;
  double local_28;
  Type *local_8;
  
  local_40 = in_XMM3_Qa;
  local_30 = in_XMM1_Qa;
  local_28 = in_XMM0_Qa;
  local_8 = in_RDI;
  if ((*(byte *)(in_RDX + 0xa8) & 1) == 0) {
    while (local_8 < in_RSI) {
      TVar1 = GradientBase32::null();
      if (0.0 <= local_28) {
        dVar2 = qSqrt<double>(5.95504486884319e-317);
        TVar1 = GradientBase32::fetchSingle
                          ((QGradientData *)CONCAT44(TVar1,in_stack_ffffffffffffffa0),
                           dVar2 - local_40);
      }
      *local_8 = TVar1;
      local_28 = local_30 + local_28;
      local_30 = in_XMM2_Qa + local_30;
      local_40 = in_XMM4_Qa + local_40;
      local_8 = local_8 + 1;
    }
  }
  else {
    for (; local_8 < in_RSI; local_8 = local_8 + 1) {
      local_4c = GradientBase32::null();
      if ((0.0 <= local_28) &&
         (dVar2 = qSqrt<double>(5.95493024561336e-317),
         0.0 <= *(double *)(in_RDX + 0x90) * (dVar2 - local_40) + *(double *)(in_RCX + 0xd8))) {
        local_4c = GradientBase32::fetchSingle
                             ((QGradientData *)
                              CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
                              in_stack_ffffffffffffff98);
      }
      *local_8 = local_4c;
      local_28 = local_30 + local_28;
      local_30 = in_XMM2_Qa + local_30;
      local_40 = in_XMM4_Qa + local_40;
    }
  }
  return;
}

Assistant:

static void fetch(BlendType *buffer, BlendType *end,
                      const Operator *op, const QSpanData *data, qreal det,
                      qreal delta_det, qreal delta_delta_det, qreal b, qreal delta_b)
    {
        if (op->radial.extended) {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    if (data->gradient.radial.focal.radius + op->radial.dr * w >= 0)
                        result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;

                ++buffer;
            }
        } else {
            while (buffer < end) {
                BlendType result = GradientBase::null();
                if (det >= 0) {
                    qreal w = qSqrt(det) - b;
                    result = GradientBase::fetchSingle(data->gradient, w);
                }

                *buffer++ = result;

                det += delta_det;
                delta_det += delta_delta_det;
                b += delta_b;
            }
        }
    }